

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void constructAutomaticIndex(Parse *pParse,WhereClause *pWC,Bitmask notReady,WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  short sVar4;
  Vdbe *p;
  SrcList *pSrcList;
  Table *pTVar5;
  WhereLoop *p_00;
  Subquery *pSVar6;
  bool bVar7;
  char cVar8;
  int addr;
  int iVar9;
  int iVar10;
  int p3;
  WhereTerm *pWVar11;
  Expr *pEVar12;
  Index *pIdx;
  CollSeq *pCVar13;
  Op *pOVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  WhereTerm *pWVar21;
  int iVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  Expr *local_78;
  long local_70;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  addr = sqlite3VdbeAddOp0(p,0xf);
  pWVar21 = pWC->a;
  pSrcList = pWC->pWInfo->pTabList;
  bVar3 = pLevel->iFrom;
  pTVar5 = pSrcList->a[bVar3].pSTab;
  pWVar11 = pWVar21 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  uVar17 = 0;
  bVar7 = false;
  local_78 = (Expr *)0x0;
  iVar22 = 0;
  for (; pWVar21 < pWVar11; pWVar21 = pWVar21 + 1) {
    if ((pWVar21->wtFlags & 2) == 0) {
      pEVar12 = pWVar21->pExpr;
      iVar9 = sqlite3ExprIsSingleTableConstraint(pEVar12,pSrcList,(uint)pLevel->iFrom,0);
      if (iVar9 != 0) {
        pEVar12 = sqlite3ExprDup(pParse->db,pEVar12,0);
        local_78 = sqlite3ExprAnd(pParse,local_78,pEVar12);
      }
    }
    iVar9 = termCanDriveIndex(pWVar21,pSrcList->a + bVar3,notReady);
    if (iVar9 != 0) {
      iVar9 = (pWVar21->u).x.leftColumn;
      uVar23 = 1L << ((byte)iVar9 & 0x3f);
      if (0x3f < iVar9) {
        uVar23 = 0x8000000000000000;
      }
      if (!bVar7) {
        sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar5->zName);
      }
      bVar7 = true;
      if ((uVar23 & uVar17) == 0) {
        iVar9 = whereLoopResize(pParse->db,p_00,iVar22 + 1);
        if (iVar9 != 0) goto LAB_00187e3a;
        p_00->aLTerm[iVar22] = pWVar21;
        uVar17 = uVar17 | uVar23;
        bVar7 = true;
        iVar22 = iVar22 + 1;
      }
    }
  }
  p_00->nLTerm = (u16)iVar22;
  (p_00->u).btree.nEq = (u16)iVar22;
  p_00->wsFlags = 0x4241;
  uVar23 = ~uVar17;
  if (pTVar5->eTabType != '\x02') {
    uVar23 = (uVar23 | 0x8000000000000000) & pSrcList->a[bVar3].colUsed;
  }
  sVar4 = pTVar5->nCol;
  iVar9 = (int)sVar4;
  cVar8 = (char)pTVar5->tabFlags;
  if (cVar8 < '\0') {
    iVar20 = 0;
    if (0 < sVar4) {
      iVar20 = iVar9;
    }
    lVar18 = 0xe;
    for (uVar15 = 0; (long)iVar20 != uVar15; uVar15 = uVar15 + 1) {
      if ((*(byte *)((long)&pTVar5->aCol->zCnName + lVar18) & 1) != 0) {
        if (0x3e < uVar15) {
          uVar23 = uVar23 | 0x8000000000000000;
          break;
        }
        uVar19 = 1L << ((byte)uVar15 & 0x3f);
        if ((uVar17 >> (uVar15 & 0x3f) & 1) != 0) {
          uVar19 = 0;
        }
        uVar23 = uVar23 | uVar19;
      }
      lVar18 = lVar18 + 0x10;
    }
  }
  iVar20 = 0x3f;
  if (sVar4 < 0x3f) {
    iVar20 = iVar9;
  }
  uVar17 = 0;
  if ((short)iVar20 < 1) {
    iVar20 = 0;
  }
  for (; (long)iVar20 != uVar17; uVar17 = uVar17 + 1) {
    iVar22 = iVar22 + (uint)((uVar23 >> (uVar17 & 0x3f) & 1) != 0);
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar22 = ((uint)((long)pSrcList->a[bVar3].colUsed >> 0x3f) & iVar9 - 0x3fU) + iVar22;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(ushort)(-1 < cVar8) + (short)iVar22,0,&local_40);
  if (pIdx != (Index *)0x0) {
    iVar9 = 0;
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar5;
    uVar17 = 0;
    bVar7 = false;
    for (pWVar21 = pWC->a; pWVar21 < pWVar11; pWVar21 = pWVar21 + 1) {
      iVar10 = termCanDriveIndex(pWVar21,pSrcList->a + bVar3,notReady);
      if (iVar10 != 0) {
        iVar10 = (pWVar21->u).x.leftColumn;
        uVar15 = 1L << ((byte)iVar10 & 0x3f);
        if (0x3f < iVar10) {
          uVar15 = 0x8000000000000000;
        }
        if ((uVar15 & uVar17) == 0) {
          pEVar12 = pWVar21->pExpr;
          pIdx->aiColumn[iVar9] = (i16)iVar10;
          pCVar13 = sqlite3ExprCompareCollSeq(pParse,pEVar12);
          pcVar16 = "BINARY";
          if (pCVar13 != (CollSeq *)0x0) {
            pcVar16 = pCVar13->zName;
          }
          uVar17 = uVar15 | uVar17;
          pIdx->azColl[iVar9] = pcVar16;
          iVar9 = iVar9 + 1;
          pEVar12 = pEVar12->pLeft;
          if ((pEVar12 != (Expr *)0x0) && (cVar8 = sqlite3ExprAffinity(pEVar12), cVar8 != 'B')) {
            bVar7 = true;
          }
        }
      }
    }
    for (uVar17 = 0; lVar18 = (long)iVar9, (long)iVar20 != uVar17; uVar17 = uVar17 + 1) {
      if ((uVar23 >> (uVar17 & 0x3f) & 1) != 0) {
        pIdx->aiColumn[lVar18] = (i16)uVar17;
        pIdx->azColl[lVar18] = "BINARY";
        iVar9 = iVar9 + 1;
      }
    }
    if ((long)pSrcList->a[bVar3].colUsed < 0) {
      for (iVar9 = 0x3f; iVar9 < pTVar5->nCol; iVar9 = iVar9 + 1) {
        pIdx->aiColumn[lVar18] = (i16)iVar9;
        pIdx->azColl[lVar18] = "BINARY";
        lVar18 = lVar18 + 1;
      }
      iVar9 = (int)lVar18;
    }
    if ((pTVar5->tabFlags & 0x80) == 0) {
      pIdx->aiColumn[iVar9] = -1;
      pIdx->azColl[iVar9] = "BINARY";
    }
    iVar20 = pParse->nTab;
    pParse->nTab = iVar20 + 1;
    pLevel->iIdxCur = iVar20;
    sqlite3VdbeAddOp2(p,0x74,iVar20,iVar22 + 1);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if (((pParse->db->dbOptFlags & 0x80000) == 0) && (bVar7)) {
      sqlite3WhereExplainBloomFilter(pParse,pWC->pWInfo,pLevel);
      iVar22 = pParse->nMem + 1;
      pParse->nMem = iVar22;
      pLevel->regFilter = iVar22;
      sqlite3VdbeAddOp2(p,0x4d,10000,iVar22);
    }
    if ((pSrcList->a[bVar3].fg.field_0x1 & 0x40) == 0) {
      iVar22 = sqlite3VdbeAddOp1(p,0x24,pLevel->iTabCur);
      local_70 = 0;
    }
    else {
      pSVar6 = pSrcList->a[bVar3].u4.pSubq;
      iVar22 = pSVar6->regReturn;
      iVar20 = sqlite3VdbeAddOp2(p,0x47,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar22,0,pSVar6->addrFillSub);
      iVar22 = sqlite3VdbeAddOp1(p,0xc,iVar22);
      local_70 = (long)iVar20;
    }
    if (local_78 == (Expr *)0x0) {
      iVar20 = 0;
    }
    else {
      iVar20 = pParse->nLabel + -1;
      pParse->nLabel = iVar20;
      sqlite3ExprIfFalse(pParse,local_78,iVar20,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    iVar10 = sqlite3GetTempReg(pParse);
    p3 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar10,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,p3,(uint)(p_00->u).btree.nEq);
    }
    sqlite3VdbeAddOp2(p,0x8a,pLevel->iIdxCur,iVar10);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_78 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar20);
    }
    if ((pSrcList->a[bVar3].fg.field_0x1 & 0x40) == 0) {
      sqlite3VdbeAddOp2(p,0x27,pLevel->iTabCur,iVar22 + 1);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar14 = p->aOp + local_70;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = p3 + iVar9;
      translateColumnToCopy
                (pParse,iVar22,pLevel->iTabCur,(pSrcList->a[bVar3].u4.pSubq)->regResult,
                 pLevel->iIdxCur);
      sqlite3VdbeGoto(p,iVar22);
      puVar2 = &pSrcList->a[bVar3].fg.field_0x1;
      *puVar2 = *puVar2 & 0xbf;
    }
    sqlite3VdbeJumpHere(p,iVar22);
    if (iVar10 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar10;
      }
    }
    sqlite3VdbeJumpHere(p,addr);
  }
LAB_00187e3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  sqlite3ExprDelete(pParse->db,local_78);
  return;
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warning has been issued */
  u8 useBloomFilter = 0;      /* True to also add a Bloom filter */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcList *pTabList;          /* The complete FROM clause */
  SrcItem *pSrc;              /* The FROM clause term to get the next index */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExp = 0;            /* Address of OP_Explain */
#endif

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTabList = pWC->pWInfo->pTabList;
  pSrc = &pTabList->a[pLevel->iFrom];
  pTable = pSrc->pSTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, pLevel->iFrom, 0)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  if( IsView(pTable) ){
    extraCols = ALLBITS & ~idxCols;
  }else{
    extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  }
  if( !HasRowid(pTable) ){
    /* For WITHOUT ROWID tables, ensure that all PRIMARY KEY columns are
    ** either in the idxCols mask or in the extraCols mask */
    for(i=0; i<pTable->nCol; i++){
      if( (pTable->aCol[i].colFlags & COLFLAG_PRIMKEY)==0 ) continue;
      if( i>=BMS-1 ){
        extraCols |= MASKBIT(BMS-1);
        break;
      }
      if( idxCols & MASKBIT(i) ) continue;
      extraCols |= MASKBIT(i);
    }
  }
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+HasRowid(pTable),
                                    0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
        if( ALWAYS(pX->pLeft!=0)
         && sqlite3ExprAffinity(pX->pLeft)!=SQLITE_AFF_TEXT
        ){
          /* TUNING: only use a Bloom filter on an automatic index
          ** if one or more key columns has the ability to hold numeric
          ** values, since strings all have the same hash in the Bloom
          ** filter implementation and hence a Bloom filter on a text column
          ** is not usually helpful. */
          useBloomFilter = 1;
        }
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  if( HasRowid(pTable) ){
    pIdx->aiColumn[n] = XN_ROWID;
    pIdx->azColl[n] = sqlite3StrBINARY;
  }

  /* Create the automatic index */
  explainAutomaticIndex(pParse, pIdx, pPartial!=0, &addrExp);
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) && useBloomFilter ){
    sqlite3WhereExplainBloomFilter(pParse, pWC->pWInfo, pLevel);
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  assert( pSrc == &pWC->pWInfo->pTabList->a[pLevel->iFrom] );
  if( pSrc->fg.viaCoroutine ){
    int regYield;
    Subquery *pSubq;
    assert( pSrc->fg.isSubquery );
    pSubq = pSrc->u4.pSubq;
    assert( pSubq!=0 );
    regYield = pSubq->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pSubq->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pSrc->pSTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeScanStatusCounters(v, addrExp, addrExp, sqlite3VdbeCurrentAddr(v));
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pSrc->fg.viaCoroutine ){
    assert( pSrc->fg.isSubquery && pSrc->u4.pSubq!=0 );
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pSrc->u4.pSubq->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pSrc->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);
  sqlite3VdbeScanStatusRange(v, addrExp, addrExp, -1);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}